

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readTile<Imf_3_2::TiledInputPart>
               (TiledInputPart *in,bool reduceMemory,bool reduceTime)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Header *pHVar4;
  reference pvVar5;
  reference pvVar6;
  Slice *pSVar7;
  Channel *pCVar8;
  reference pvVar9;
  byte in_DL;
  byte in_SIL;
  FrameBuffer *in_RDI;
  int x;
  int y;
  int xlevel;
  int ylevel;
  bool isRipMap;
  size_t tileIndex;
  size_t step;
  ConstIterator c;
  ChannelList *channelList;
  int channelIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  uint64_t bytes;
  TileDescription *td;
  int numYLevels;
  int numXLevels;
  int dwx;
  uint64_t w;
  Box2i *dw;
  bool threw;
  int in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  allocator_type *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  Slice local_1a8 [56];
  Slice local_170 [56];
  Slice local_138 [56];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  int local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<float,_std::allocator<float>_> local_c0;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> local_a0;
  char local_88 [48];
  long local_58;
  int *local_50;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  int *local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  FrameBuffer *local_10;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = 0;
  local_10 = in_RDI;
  Imf_3_2::TiledInputPart::header();
  local_20 = (int *)Imf_3_2::Header::dataWindow();
  local_38 = ((long)local_20[2] - (long)*local_20) + 1;
  local_3c = *local_20;
  local_40 = Imf_3_2::TiledInputPart::numXLevels();
  local_44 = Imf_3_2::TiledInputPart::numYLevels();
  Imf_3_2::TiledInputPart::header();
  local_50 = (int *)Imf_3_2::Header::tileDescription();
  pHVar4 = (Header *)Imf_3_2::TiledInputPart::header();
  local_58 = Imf_3_2::calculateBytesPerPixel(pHVar4);
  if (((local_11 & 1) == 0) ||
     (((ulong)(local_38 * local_58) < 0x7a1201 &&
      ((ulong)(uint)(*local_50 * local_50[1]) * local_58 < 0xf4241)))) {
    FrameBuffer::FrameBuffer((FrameBuffer *)0x11c09e);
    std::allocator<Imath_3_2::half>::allocator((allocator<Imath_3_2::half> *)0x11c0c3);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
              ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               (allocator_type *)in_stack_fffffffffffffd10);
    std::allocator<Imath_3_2::half>::~allocator((allocator<Imath_3_2::half> *)0x11c0ef);
    std::allocator<float>::allocator((allocator<float> *)0x11c114);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               (allocator_type *)in_stack_fffffffffffffd10);
    std::allocator<float>::~allocator((allocator<float> *)0x11c140);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x11c165);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               in_stack_fffffffffffffd10);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x11c191);
    local_e8 = 0;
    Imf_3_2::TiledInputPart::header();
    local_f0 = Imf_3_2::Header::channels();
    local_f8 = Imf_3_2::ChannelList::begin();
    while( true ) {
      local_100 = Imf_3_2::ChannelList::end();
      bVar1 = operator!=((ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                         (ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (!bVar1) break;
      iVar2 = local_e8 % 3;
      if (iVar2 == 0) {
        pSVar7 = (Slice *)ChannelList::ConstIterator::name((ConstIterator *)0x11c356);
        iVar2 = -local_3c;
        pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c385);
        pvVar5 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                           (&local_a0,(long)(iVar2 / *(int *)(pCVar8 + 4)));
        pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c3ba);
        iVar2 = *(int *)(pCVar8 + 4);
        pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c3d1);
        in_stack_fffffffffffffcf8 = *(int *)(pCVar8 + 8);
        in_stack_fffffffffffffd00 = 0;
        Imf_3_2::Slice::Slice
                  (local_138,HALF,(char *)pvVar5,2,0,iVar2,in_stack_fffffffffffffcf8,0.0,false,false
                  );
        Imf_3_2::FrameBuffer::insert(local_88,pSVar7);
      }
      else {
        if (iVar2 == 1) {
          pSVar7 = (Slice *)ChannelList::ConstIterator::name((ConstIterator *)0x11c449);
          iVar2 = -local_3c;
          pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c46f);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_c0,(long)(iVar2 / *(int *)(pCVar8 + 4)));
          pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c49b);
          iVar2 = *(int *)(pCVar8 + 4);
          pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c4ac);
          Imf_3_2::Slice::Slice
                    (local_170,FLOAT,(char *)pvVar6,4,0,iVar2,*(int *)(pCVar8 + 8),0.0,false,false);
          Imf_3_2::FrameBuffer::insert(local_88,pSVar7);
        }
        else if (iVar2 != 2) goto LAB_0011c5d5;
        pSVar7 = (Slice *)ChannelList::ConstIterator::name((ConstIterator *)0x11c518);
        iVar2 = -local_3c;
        pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c53e);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_e0,(long)(iVar2 / *(int *)(pCVar8 + 4)));
        pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c56a);
        iVar2 = *(int *)(pCVar8 + 4);
        pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x11c57b);
        in_stack_fffffffffffffcf8 = *(int *)(pCVar8 + 8);
        in_stack_fffffffffffffd00 = 0;
        Imf_3_2::Slice::Slice
                  (local_1a8,UINT,(char *)pvVar9,4,0,iVar2,in_stack_fffffffffffffcf8,0.0,false,false
                  );
        Imf_3_2::FrameBuffer::insert(local_88,pSVar7);
      }
LAB_0011c5d5:
      local_e8 = local_e8 + 1;
      ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    }
    Imf_3_2::TiledInputPart::setFrameBuffer(local_10);
    for (local_1c0 = 0; local_1c0 < local_44; local_1c0 = local_1c0 + 1) {
      for (local_1c4 = 0; local_1c4 < local_40; local_1c4 = local_1c4 + 1) {
        local_1c8 = 0;
        while (iVar2 = local_1c8, iVar3 = Imf_3_2::TiledInputPart::numYTiles((int)local_10),
              iVar2 < iVar3) {
          local_1cc = 0;
          while (iVar2 = local_1cc, iVar3 = Imf_3_2::TiledInputPart::numXTiles((int)local_10),
                iVar2 < iVar3) {
            Imf_3_2::TiledInputPart::readTile((int)local_10,local_1cc,local_1c8,local_1c4);
            local_1cc = local_1cc + 1;
          }
          local_1c8 = local_1c8 + 1;
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd10);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd10);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector
              ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
               in_stack_fffffffffffffd10);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x11c890);
    local_1 = (bool)(local_13 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
readTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx        = dw.min.x;
        int numXLevels = in.numXLevels ();
        int numYLevels = in.numYLevels ();

        const TileDescription& td    = in.header ().tileDescription ();
        uint64_t               bytes = calculateBytesPerPixel (in.header ());

        if (reduceMemory && (w * bytes > gMaxBytesPerScanline ||
                             (td.xSize * td.ySize * bytes) > gMaxTileBytes))
        {
            return false;
        }

        FrameBuffer i;
        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert (
                        c.name (),
                        Slice (
                            HALF,
                            (char*) &halfChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (half),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
                case 1:
                    i.insert (
                        c.name (),
                        Slice (
                            FLOAT,
                            (char*) &floatChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (float),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                case 2:
                    i.insert (
                        c.name (),
                        Slice (
                            UINT,
                            (char*) &uintChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (unsigned int),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        size_t step = 1;

        size_t tileIndex = 0;
        bool   isRipMap  = td.mode == RIPMAP_LEVELS;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {
                                in.readTile (x, y, xlevel, ylevel);
                            }
                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;

                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}